

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_aggregate.cpp
# Opt level: O2

void duckdb::RowOperations::InitializeStates
               (TupleDataLayout *layout,Vector *addresses,SelectionVector *sel,idx_t count)

{
  data_ptr_t pdVar1;
  pointer pAVar2;
  long lVar3;
  aggregate_initialize_t p_Var4;
  size_type __n;
  ulong uVar5;
  const_reference pvVar6;
  idx_t i;
  ulong uVar7;
  pointer pAVar8;
  
  if (count != 0) {
    pdVar1 = addresses->data;
    __n = ((long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(layout->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
    pAVar2 = (layout->aggregates).
             super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
             super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pAVar8 = (layout->aggregates).
                  super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
                  super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar8 != pAVar2; pAVar8 = pAVar8 + 1)
    {
      for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
        uVar5 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)sel->sel_vector[uVar7];
        }
        lVar3 = *(long *)(pdVar1 + uVar5 * 8);
        p_Var4 = (pAVar8->function).initialize;
        pvVar6 = vector<unsigned_long,_true>::get<true>(&layout->offsets,__n);
        (*p_Var4)(&pAVar8->function,(data_ptr_t)(lVar3 + *pvVar6));
      }
      __n = __n + 1;
    }
  }
  return;
}

Assistant:

void RowOperations::InitializeStates(TupleDataLayout &layout, Vector &addresses, const SelectionVector &sel,
                                     idx_t count) {
	if (count == 0) {
		return;
	}
	auto pointers = FlatVector::GetData<data_ptr_t>(addresses);
	auto &offsets = layout.GetOffsets();
	auto aggr_idx = layout.ColumnCount();

	for (const auto &aggr : layout.GetAggregates()) {
		for (idx_t i = 0; i < count; ++i) {
			auto row_idx = sel.get_index(i);
			auto row = pointers[row_idx];
			aggr.function.initialize(aggr.function, row + offsets[aggr_idx]);
		}
		++aggr_idx;
	}
}